

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
          (ExtendableDataDictionary *this,FieldDef *field_def)

{
  bool bVar1;
  invalid_argument *this_00;
  FieldDef *pFVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_bool>
  pVar3;
  string local_f8 [32];
  undefined1 local_d8 [8];
  optional<bidfx_public_api::price::pixie::FieldDef> previous_1;
  undefined1 local_90 [8];
  optional<bidfx_public_api::price::pixie::FieldDef> previous;
  FieldDef local_48;
  FieldDef *local_18;
  FieldDef *field_def_local;
  ExtendableDataDictionary *this_local;
  
  local_18 = field_def;
  field_def_local = (FieldDef *)this;
  FieldDef::FieldDef(&local_48,field_def);
  bVar1 = DataDictionaryUtils::IsValid(&local_48);
  FieldDef::~FieldDef(&local_48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid field def added to dictionary");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::
          map<int,_bidfx_public_api::price::pixie::FieldDef,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
          ::empty(&this->field_defs_by_fid_);
  if (!bVar1) {
    (**(this->super_IDataDictionary)._vptr_IDataDictionary)
              (local_90,this,(ulong)(uint)field_def->fid_);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_90);
    if (bVar1) {
      pFVar2 = std::optional<bidfx_public_api::price::pixie::FieldDef>::operator*
                         ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_90);
      HandleDuplicatedFid(this,pFVar2);
    }
    std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional
              ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_90);
  }
  pVar3 = std::
          map<int,bidfx_public_api::price::pixie::FieldDef,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
          ::emplace<int&,bidfx_public_api::price::pixie::FieldDef&>
                    ((map<int,bidfx_public_api::price::pixie::FieldDef,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
                      *)&this->field_defs_by_fid_,&field_def->fid_,field_def);
  previous_1.super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>._M_payload
  .super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
  super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._48_8_ =
       pVar3.first._M_node;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
          ::empty(&this->field_def_by_name_);
  if (!bVar1) {
    std::__cxx11::string::string(local_f8,(string *)&field_def->name_);
    (*(this->super_IDataDictionary)._vptr_IDataDictionary[1])(local_d8,this,local_f8);
    std::__cxx11::string::~string(local_f8);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_d8);
    if (bVar1) {
      pFVar2 = std::optional<bidfx_public_api::price::pixie::FieldDef>::operator*
                         ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_d8);
      HandleDuplicatedName(this,pFVar2);
    }
    std::optional<bidfx_public_api::price::pixie::FieldDef>::~optional
              ((optional<bidfx_public_api::price::pixie::FieldDef> *)local_d8);
  }
  std::
  map<std::__cxx11::string,bidfx_public_api::price::pixie::FieldDef,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
  ::emplace<std::__cxx11::string&,bidfx_public_api::price::pixie::FieldDef&>
            ((map<std::__cxx11::string,bidfx_public_api::price::pixie::FieldDef,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
              *)&this->field_def_by_name_,&field_def->name_,field_def);
  return;
}

Assistant:

void ExtendableDataDictionary::AddFieldDef(FieldDef field_def)
{
    if (!DataDictionaryUtils::IsValid(field_def))
    {
        throw std::invalid_argument("invalid field def added to dictionary");
    }

    if (!field_defs_by_fid_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByFid(field_def.fid_);
        if (previous)
        {
            HandleDuplicatedFid(*previous);
        }
    }
    field_defs_by_fid_.emplace(field_def.fid_, field_def);
    if (!field_def_by_name_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByName(field_def.name_);
        if (previous)
        {
            HandleDuplicatedName(*previous);
        }
    }
    field_def_by_name_.emplace(field_def.name_, field_def);
}